

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void child_reap(ev_loop *loop,int chain,int pid,int status)

{
  WL peStack_28;
  int traced;
  ev_child *w;
  int status_local;
  int pid_local;
  int chain_local;
  ev_loop *loop_local;
  
  for (peStack_28 = childs[(int)(chain & 0xf)]; peStack_28 != (WL)0x0; peStack_28 = peStack_28->next
      ) {
    if (((peStack_28[1].pending == pid) || (peStack_28[1].pending == 0)) &&
       (((status & 0xffU) != 0x7f && status != 0xffff || ((peStack_28[1].active & 1U) != 0)))) {
      peStack_28->priority = 2;
      peStack_28[1].priority = pid;
      *(int *)&peStack_28[1].field_0xc = status;
      ev_feed_event(loop,peStack_28,0x800);
    }
  }
  return;
}

Assistant:

inline_speed void
child_reap (EV_P_ int chain, int pid, int status)
{
  ev_child *w;
  int traced = WIFSTOPPED (status) || WIFCONTINUED (status);

  for (w = (ev_child *)childs [chain & ((EV_PID_HASHSIZE) - 1)]; w; w = (ev_child *)((WL)w)->next)
    {
      if ((w->pid == pid || !w->pid)
          && (!traced || (w->flags & 1)))
        {
          ev_set_priority (w, EV_MAXPRI); /* need to do it *now*, this *must* be the same prio as the signal watcher itself */
          w->rpid    = pid;
          w->rstatus = status;
          ev_feed_event (EV_A_ (W)w, EV_CHILD);
        }
    }
}